

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_SignTransactionTest_Test::TestBody
          (cfdcapi_transaction_SignTransactionTest_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *in_R9;
  long *expected_predicate_value;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  int tmp_ret;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  char *tapscript_err_msg;
  char *err_msg;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  char *tx_hex;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  uint32_t code_separator_pos;
  AssertionResult gtest_ar_4;
  bool has_tapscript;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  char *tmp_sig;
  char *sig;
  char *sighash;
  void *create_handle;
  size_t idx;
  size_t list_size;
  CfdSignTransactionTestData exp_datas [7];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined1 in_stack_00000c7f;
  char *in_stack_00000c80;
  int64_t in_stack_00000c88;
  uint32_t in_stack_00000c94;
  char *in_stack_00000c98;
  void *in_stack_00000ca0;
  void *in_stack_00000ca8;
  char *in_stack_00000cc0;
  char *in_stack_00000cc8;
  char *in_stack_00000cd0;
  char *in_stack_00000cd8;
  bool *in_stack_fffffffffffff4a8;
  AssertionResult *in_stack_fffffffffffff4b0;
  undefined4 uVar7;
  int *piVar6;
  CfdErrorCode *in_stack_fffffffffffff4b8;
  char *in_stack_fffffffffffff4c0;
  void **in_stack_fffffffffffff4c8;
  char **in_stack_fffffffffffff540;
  AssertionResult *in_stack_fffffffffffff548;
  char **in_stack_fffffffffffff630;
  AssertionResult *in_stack_fffffffffffff638;
  undefined7 in_stack_fffffffffffff640;
  undefined1 in_stack_fffffffffffff647;
  char *in_stack_fffffffffffff648;
  bool *local_958;
  AssertionResult *this_00;
  int in_stack_fffffffffffff720;
  uint32_t in_stack_fffffffffffff724;
  char *in_stack_fffffffffffff728;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffff738;
  AssertHelper local_898;
  Message local_890;
  undefined4 local_884;
  AssertionResult local_880;
  AssertHelper local_870;
  undefined1 in_stack_fffffffffffff79b;
  int in_stack_fffffffffffff79c;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  char *in_stack_fffffffffffff7a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7bc;
  AssertHelper local_840;
  Message local_838;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  AssertionResult local_828;
  AssertHelper local_818;
  Message local_810;
  undefined4 local_804;
  AssertionResult local_800;
  AssertHelper local_7f0;
  Message local_7e8 [2];
  char **in_stack_fffffffffffff828;
  char *in_stack_fffffffffffff830;
  char *in_stack_fffffffffffff838;
  AssertHelper in_stack_fffffffffffff840;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff848;
  AssertionResult local_7b0;
  AssertHelper local_7a0;
  Message local_798;
  undefined4 local_78c;
  AssertionResult local_788;
  char *local_778;
  AssertHelper local_770;
  Message local_768;
  undefined4 local_75c;
  AssertionResult local_758;
  AssertHelper local_748;
  Message local_740;
  undefined4 local_734;
  AssertionResult local_730;
  undefined1 in_stack_fffffffffffff8e2;
  undefined1 in_stack_fffffffffffff8e3;
  int in_stack_fffffffffffff8e4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff8e8;
  uint32_t in_stack_fffffffffffff8f4;
  char *in_stack_fffffffffffff8f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff900;
  AssertHelper in_stack_fffffffffffff908;
  Message local_6f0;
  undefined4 local_6e4;
  AssertionResult local_6e0;
  AssertHelper in_stack_fffffffffffff930;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff938;
  AssertionResult local_6b8;
  AssertHelper local_6a8;
  Message local_6a0;
  undefined4 local_694;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff978;
  AssertHelper in_stack_fffffffffffff980;
  uint32_t in_stack_fffffffffffff98c;
  uint32_t in_stack_fffffffffffff990;
  int in_stack_fffffffffffff994;
  void *in_stack_fffffffffffff998;
  AssertHelper local_658;
  undefined1 in_stack_fffffffffffff9b5;
  undefined1 in_stack_fffffffffffff9b6;
  undefined1 in_stack_fffffffffffff9b7;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  int in_stack_fffffffffffff9c0;
  uint32_t in_stack_fffffffffffff9c4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9c8;
  undefined6 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d6;
  undefined1 in_stack_fffffffffffff9d7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9e0;
  uint32_t in_stack_fffffffffffff9e4;
  char *in_stack_fffffffffffff9e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  Message local_600;
  undefined4 local_5f4;
  char *in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa20;
  Message local_5d8;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 uVar8;
  char *in_stack_fffffffffffffa38;
  uint32_t in_stack_fffffffffffffa44;
  AssertHelper in_stack_fffffffffffffa48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 uVar9;
  AssertionResult local_5a0;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 uVar10;
  AssertHelper in_stack_fffffffffffffa78;
  Message local_580;
  undefined4 local_574;
  AssertionResult local_570;
  byte local_559;
  AssertHelper local_558;
  Message local_550;
  undefined4 local_544;
  AssertionResult local_540;
  AssertHelper local_530;
  Message local_528;
  undefined4 local_51c;
  AssertionResult local_518;
  string local_508;
  AssertHelper local_4e8;
  Message local_4e0;
  undefined1 local_4d1;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined4 local_4ac;
  AssertionResult local_4a8;
  long local_498;
  bool *local_490;
  long local_488;
  long local_480;
  ulong local_478;
  ulong local_470;
  undefined1 local_468 [24];
  long alStack_450 [9];
  long alStack_408 [3];
  byte abStack_3f0 [8];
  byte abStack_3e8 [296];
  char *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  int64_t in_stack_fffffffffffffd58;
  void *in_stack_fffffffffffffd60;
  void *in_stack_fffffffffffffd68;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_79;
  AssertionResult local_78;
  AssertHelper local_68;
  Message local_60 [3];
  undefined4 local_44;
  AssertionResult local_40;
  int local_2c;
  long local_28;
  
  local_28 = 0;
  local_2c = CfdCreateHandle(in_stack_fffffffffffff4c8);
  local_44 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
             (int *)in_stack_fffffffffffff4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  local_958 = in_stack_fffffffffffff4a8;
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d4f4f);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x68,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x3d4fb2);
    local_958 = in_stack_fffffffffffff4a8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5007);
  local_79 = local_28 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff4b0,local_958,(type *)0x3d503b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&local_78,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x69,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message((Message *)0x3d5137);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d51b2);
  memcpy(local_468,&DAT_00b62100,0x3b8);
  local_470 = 7;
  for (local_478 = 0; local_478 < local_470; local_478 = local_478 + 1) {
    local_480 = 0;
    local_488 = 0;
    local_490 = (bool *)0x0;
    local_498 = 0;
    expected_predicate_value = &local_480;
    local_2c = CfdInitializeTransaction
                         (in_stack_fffffffffffff998,in_stack_fffffffffffff994,
                          in_stack_fffffffffffff990,in_stack_fffffffffffff98c,
                          (char *)in_stack_fffffffffffff980.data_,
                          (void **)in_stack_fffffffffffff978.ptr_);
    local_4ac = 0;
    this_01 = &local_4a8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8
               ,(int *)in_stack_fffffffffffff4b0);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_4b8);
      in_stack_fffffffffffff728 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3d5316);
      testing::internal::AssertHelper::AssertHelper
                (&local_4c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0xf1,in_stack_fffffffffffff728);
      testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
      testing::internal::AssertHelper::~AssertHelper(&local_4c0);
      testing::Message::~Message((Message *)0x3d5379);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d53ce);
    local_4d1 = local_480 != 0;
    this_00 = &local_4d0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffff4b0,local_958,(type *)0x3d5402);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    in_stack_fffffffffffff724 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff724);
    if (!bVar1) {
      testing::Message::Message(&local_4e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_508,(internal *)&local_4d0,(AssertionResult *)"(NULL == create_handle)",
                 "true","false",(char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0xf2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
      testing::internal::AssertHelper::~AssertHelper(&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      testing::Message::~Message((Message *)0x3d54fe);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5579);
    if (local_2c == 0) {
      local_958 = (bool *)alStack_450[local_478 * 0x11];
      in_stack_fffffffffffff4c8 =
           (void **)CONCAT44((int)((ulong)in_stack_fffffffffffff4c8 >> 0x20),1);
      in_stack_fffffffffffff4c0 = (char *)0x0;
      in_stack_fffffffffffff4b8 = (CfdErrorCode *)0x0;
      in_stack_fffffffffffff4b0 = (AssertionResult *)0x0;
      local_2c = CfdSetTransactionUtxoData
                           (in_stack_00000ca8,in_stack_00000ca0,in_stack_00000c98,in_stack_00000c94,
                            in_stack_00000c88,in_stack_00000c80,in_stack_00000cc0,in_stack_00000cc8,
                            in_stack_00000cd0,in_stack_00000cd8,(bool)in_stack_00000c7f);
      local_51c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                 in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
      if (!bVar1) {
        testing::Message::Message(&local_528);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d56ac);
        testing::internal::AssertHelper::AssertHelper
                  (&local_530,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0xf7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_530,&local_528);
        testing::internal::AssertHelper::~AssertHelper(&local_530);
        testing::Message::~Message((Message *)0x3d570f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5767);
      local_2c = CfdAddTransactionOutput
                           (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                            in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                            in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      local_544 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                 in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_540);
      if (!bVar1) {
        testing::Message::Message(&local_550);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d585b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_558,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0xfb,pcVar4);
        testing::internal::AssertHelper::operator=(&local_558,&local_550);
        testing::internal::AssertHelper::~AssertHelper(&local_558);
        testing::Message::~Message((Message *)0x3d58be);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5913);
      local_559 = 0;
      if (local_2c == 0) {
        if ((abStack_3e8[local_478 * 0x88] & 1) == 0) {
          uVar10 = 0xffffffff;
          if (alStack_450[local_478 * 0x11 + 2] == 0) {
            local_958 = (bool *)alStack_408[local_478 * 0x11 + -2];
          }
          else {
            local_958 = (bool *)0x0;
          }
          in_stack_fffffffffffff4b0 = (AssertionResult *)alStack_450[local_478 * 0x11 + 2];
          in_stack_fffffffffffff4b8 = (CfdErrorCode *)alStack_450[local_478 * 0x11 + 4];
          in_stack_fffffffffffff4c8 = (void **)alStack_408[local_478 * 0x11 + -4];
          in_stack_fffffffffffff4c0 =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffff4c0 >> 0x20),0xffffffff);
          local_2c = CfdCreateSighashByHandle
                               (exp_datas[2].aux_rand,exp_datas[2].annex,exp_datas[2].tapleaf_hash,
                                exp_datas[2].tapscript_control._4_4_,
                                (int)exp_datas[2].tapscript_control,exp_datas[2].redeem_script._7_1_
                                ,(char *)exp_datas[2]._96_8_,exp_datas[2].txout_address,
                                (char *)exp_datas[2].amount,(uint32_t)exp_datas[2].signed_tx,
                                (char *)exp_datas[2]._128_8_,(char **)exp_datas[3]._0_8_);
          uVar9 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                     in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5a0);
          if (!bVar1) {
            testing::Message::Message((Message *)&stack0xfffffffffffffa50);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d5d49);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffa48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x10f,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffa48,(Message *)&stack0xfffffffffffffa50)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa48)
            ;
            testing::Message::~Message((Message *)0x3d5dac);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5e01);
          if (local_2c == 0) {
            sVar5 = strlen((char *)alStack_408[local_478 * 0x11 + -2]);
            if (sVar5 == 0x40) {
              local_2c = CfdSignSchnorr(in_stack_fffffffffffff848.ptr_,
                                        (char *)in_stack_fffffffffffff840.data_,
                                        in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                                        in_stack_fffffffffffff828);
              uVar8 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffa38);
              if (!bVar1) {
                testing::Message::Message(&local_5d8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d5f2e);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffa20,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x116,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffffa20,&local_5d8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffa20);
                testing::Message::~Message((Message *)0x3d5f91);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5fe9);
              local_2c = CfdAddSighashTypeInSchnorrSignature
                                   (in_stack_fffffffffffff648,
                                    (char *)CONCAT17(in_stack_fffffffffffff647,
                                                     in_stack_fffffffffffff640),
                                    (int)((ulong)in_stack_fffffffffffff638 >> 0x20),
                                    SUB81((ulong)in_stack_fffffffffffff638 >> 0x18,0),
                                    in_stack_fffffffffffff630);
              local_5f4 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              uVar7 = (undefined4)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffa10);
              if (!bVar1) {
                testing::Message::Message(&local_600);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d60d6);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff9f8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x119,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff9f8,&local_600);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff9f8);
                testing::Message::~Message((Message *)0x3d6139);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d6191);
              if (alStack_450[local_478 * 0x11 + 2] == 0) {
                in_stack_fffffffffffff4b0 = (AssertionResult *)alStack_408[local_478 * 0x11 + -4];
                local_958 = (bool *)0x0;
                local_2c = CfdAddTaprootSignByHandle
                                     ((void *)CONCAT44(uVar9,in_stack_fffffffffffffa58),
                                      in_stack_fffffffffffffa50.ptr_,
                                      (char *)in_stack_fffffffffffffa48.data_,
                                      in_stack_fffffffffffffa44,in_stack_fffffffffffffa38,
                                      (char *)CONCAT44(uVar8,in_stack_fffffffffffffa30),
                                      (char *)CONCAT44(uVar10,in_stack_fffffffffffffa70),
                                      (char *)in_stack_fffffffffffffa78.data_);
                in_stack_fffffffffffff994 = 0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                           in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffff998);
                if (!bVar1) {
                  testing::Message::Message((Message *)&stack0xfffffffffffff988);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d6671);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffff980,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,300,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xfffffffffffff980,
                             (Message *)&stack0xfffffffffffff988);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffff980);
                  testing::Message::~Message((Message *)0x3d66d4);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d6729);
              }
              else {
                local_559 = 1;
                piVar6 = (int *)CONCAT44(uVar7,(int)alStack_408[local_478 * 0x11]);
                in_stack_fffffffffffff4c0 =
                     (char *)CONCAT44((int)((ulong)in_stack_fffffffffffff4c0 >> 0x20),1);
                in_stack_fffffffffffff4b8 =
                     (CfdErrorCode *)((ulong)in_stack_fffffffffffff4b8 & 0xffffffff00000000);
                local_2c = CfdAddTxSignByHandle
                                     (in_stack_fffffffffffff9d8.ptr_,
                                      (void *)CONCAT17(in_stack_fffffffffffff9d7,
                                                       CONCAT16(in_stack_fffffffffffff9d6,
                                                                in_stack_fffffffffffff9d0)),
                                      (char *)in_stack_fffffffffffff9c8.ptr_,
                                      in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                                      (char *)CONCAT44(in_stack_fffffffffffff9bc,
                                                       in_stack_fffffffffffff9b8),
                                      (bool)in_stack_fffffffffffff9b7,in_stack_fffffffffffff9f8,
                                      (bool)in_stack_fffffffffffff9b6,
                                      (bool)in_stack_fffffffffffff9b5);
                in_stack_fffffffffffff9e4 = 0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                           in_stack_fffffffffffff4b8,piVar6);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffff9e8);
                if (!bVar1) {
                  testing::Message::Message((Message *)&stack0xfffffffffffff9d8);
                  in_stack_fffffffffffff648 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x3d62d9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffff9d0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x121,in_stack_fffffffffffff648);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xfffffffffffff9d0,
                             (Message *)&stack0xfffffffffffff9d8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffff9d0);
                  testing::Message::~Message((Message *)0x3d633c);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d6394);
                local_958 = (bool *)alStack_450[local_478 * 0x11 + 3];
                in_stack_fffffffffffff4b0 = (AssertionResult *)alStack_408[local_478 * 0x11 + -4];
                local_2c = CfdAddTaprootSignByHandle
                                     ((void *)CONCAT44(uVar9,in_stack_fffffffffffffa58),
                                      in_stack_fffffffffffffa50.ptr_,
                                      (char *)in_stack_fffffffffffffa48.data_,
                                      in_stack_fffffffffffffa44,in_stack_fffffffffffffa38,
                                      (char *)CONCAT44(uVar8,in_stack_fffffffffffffa30),
                                      (char *)CONCAT44(uVar10,in_stack_fffffffffffffa70),
                                      (char *)in_stack_fffffffffffffa78.data_);
                in_stack_fffffffffffff9bc = 0;
                in_stack_fffffffffffff638 = (AssertionResult *)&stack0xfffffffffffff9c0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                           in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
                in_stack_fffffffffffff647 =
                     testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff638);
                if (!(bool)in_stack_fffffffffffff647) {
                  testing::Message::Message((Message *)&stack0xfffffffffffff9b0);
                  in_stack_fffffffffffff630 =
                       (char **)testing::AssertionResult::failure_message
                                          ((AssertionResult *)0x3d64a6);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_658,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x127,(char *)in_stack_fffffffffffff630);
                  testing::internal::AssertHelper::operator=
                            (&local_658,(Message *)&stack0xfffffffffffff9b0);
                  testing::internal::AssertHelper::~AssertHelper(&local_658);
                  testing::Message::~Message((Message *)0x3d6509);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d655e);
              }
            }
            else if (alStack_450[local_478 * 0x11 + 2] == 0) {
              local_2c = CfdCalculateEcSignature
                                   ((void *)CONCAT44(in_stack_fffffffffffff7bc,
                                                     in_stack_fffffffffffff7b8),
                                    (char *)in_stack_fffffffffffff7b0.ptr_,in_stack_fffffffffffff7a8
                                    ,(char *)CONCAT44(in_stack_fffffffffffff7a4,
                                                      in_stack_fffffffffffff7a0),
                                    in_stack_fffffffffffff79c,(bool)in_stack_fffffffffffff79b,
                                    (char **)CONCAT44(in_stack_fffffffffffff7d4,
                                                      in_stack_fffffffffffff7d0));
              local_734 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              uVar10 = (undefined4)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
              uVar9 = (undefined4)((ulong)in_stack_fffffffffffff4b8 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_730);
              if (!bVar1) {
                testing::Message::Message(&local_740);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d6f7e);
                testing::internal::AssertHelper::AssertHelper
                          (&local_748,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x14a,pcVar4);
                testing::internal::AssertHelper::operator=(&local_748,&local_740);
                testing::internal::AssertHelper::~AssertHelper(&local_748);
                testing::Message::~Message((Message *)0x3d6fe1);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7039);
              in_stack_fffffffffffff4b8 =
                   (CfdErrorCode *)CONCAT44(uVar9,(int)alStack_408[local_478 * 0x11]);
              in_stack_fffffffffffff4c0 =
                   (char *)((ulong)in_stack_fffffffffffff4c0 & 0xffffffff00000000);
              in_stack_fffffffffffff4b0 = (AssertionResult *)CONCAT44(uVar10,1);
              local_958 = local_490;
              local_2c = CfdAddPubkeyHashSignByHandle
                                   ((void *)CONCAT44(in_stack_fffffffffffff9fc,
                                                     in_stack_fffffffffffff9f8),
                                    in_stack_fffffffffffff9f0.ptr_,in_stack_fffffffffffff9e8,
                                    in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0,
                                    (char *)in_stack_fffffffffffff9d8.ptr_,in_stack_fffffffffffffa10
                                    ,(bool)in_stack_fffffffffffff9d7,in_stack_fffffffffffffa20,
                                    (bool)in_stack_fffffffffffff9d6);
              local_75c = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_758);
              if (!bVar1) {
                testing::Message::Message(&local_768);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d715c);
                testing::internal::AssertHelper::AssertHelper
                          (&local_770,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x150,pcVar4);
                testing::internal::AssertHelper::operator=(&local_770,&local_768);
                testing::internal::AssertHelper::~AssertHelper(&local_770);
                testing::Message::~Message((Message *)0x3d71bf);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7214);
            }
            else {
              uVar10 = (undefined4)((ulong)&local_490 >> 0x20);
              local_2c = CfdCalculateEcSignature
                                   ((void *)CONCAT44(in_stack_fffffffffffff7bc,
                                                     in_stack_fffffffffffff7b8),
                                    (char *)in_stack_fffffffffffff7b0.ptr_,in_stack_fffffffffffff7a8
                                    ,(char *)CONCAT44(in_stack_fffffffffffff7a4,
                                                      in_stack_fffffffffffff7a0),
                                    in_stack_fffffffffffff79c,(bool)in_stack_fffffffffffff79b,
                                    (char **)CONCAT44(in_stack_fffffffffffff7d4,
                                                      in_stack_fffffffffffff7d0));
              local_694 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              uVar8 = (undefined4)((ulong)in_stack_fffffffffffff4c0 >> 0x20);
              uVar9 = (undefined4)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffff970);
              if (!bVar1) {
                testing::Message::Message(&local_6a0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d6856);
                testing::internal::AssertHelper::AssertHelper
                          (&local_6a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x133,pcVar4);
                testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
                testing::internal::AssertHelper::~AssertHelper(&local_6a8);
                testing::Message::~Message((Message *)0x3d68b9);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d6911);
              piVar6 = (int *)CONCAT44(uVar9,(int)alStack_408[local_478 * 0x11]);
              in_stack_fffffffffffff4c0 = (char *)CONCAT44(uVar8,1);
              in_stack_fffffffffffff4b8 =
                   (CfdErrorCode *)((ulong)in_stack_fffffffffffff4b8 & 0xffffffff00000000);
              local_2c = CfdAddTxSignByHandle
                                   (in_stack_fffffffffffff9d8.ptr_,
                                    (void *)CONCAT17(in_stack_fffffffffffff9d7,
                                                     CONCAT16(in_stack_fffffffffffff9d6,
                                                              in_stack_fffffffffffff9d0)),
                                    (char *)in_stack_fffffffffffff9c8.ptr_,in_stack_fffffffffffff9c4
                                    ,in_stack_fffffffffffff9c0,
                                    (char *)CONCAT44(in_stack_fffffffffffff9bc,
                                                     in_stack_fffffffffffff9b8),
                                    (bool)in_stack_fffffffffffff9b7,in_stack_fffffffffffff9f8,
                                    (bool)in_stack_fffffffffffff9b6,(bool)in_stack_fffffffffffff9b5)
              ;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,piVar6);
              uVar9 = (undefined4)((ulong)piVar6 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6b8);
              if (!bVar1) {
                testing::Message::Message((Message *)&stack0xfffffffffffff938);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d6a2e);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff930,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x13a,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff930,
                           (Message *)&stack0xfffffffffffff938);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff930);
                testing::Message::~Message((Message *)0x3d6a91);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d6ae9);
              in_stack_fffffffffffff4b0 =
                   (AssertionResult *)CONCAT44(uVar9,(int)alStack_408[local_478 * 0x11]);
              in_stack_fffffffffffff4c0 =
                   (char *)((ulong)in_stack_fffffffffffff4c0 & 0xffffffff00000000);
              in_stack_fffffffffffff4b8 =
                   (CfdErrorCode *)((ulong)in_stack_fffffffffffff4b8 & 0xffffffff00000000);
              local_958 = (bool *)CONCAT44(uVar10,1);
              local_2c = CfdAddTxSignByHandle
                                   (in_stack_fffffffffffff9d8.ptr_,
                                    (void *)CONCAT17(in_stack_fffffffffffff9d7,
                                                     CONCAT16(in_stack_fffffffffffff9d6,
                                                              in_stack_fffffffffffff9d0)),
                                    (char *)in_stack_fffffffffffff9c8.ptr_,in_stack_fffffffffffff9c4
                                    ,in_stack_fffffffffffff9c0,
                                    (char *)CONCAT44(in_stack_fffffffffffff9bc,
                                                     in_stack_fffffffffffff9b8),
                                    (bool)in_stack_fffffffffffff9b7,in_stack_fffffffffffff9f8,
                                    (bool)in_stack_fffffffffffff9b6,(bool)in_stack_fffffffffffff9b5)
              ;
              local_6e4 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6e0);
              if (!bVar1) {
                testing::Message::Message(&local_6f0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d6c07);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff908,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x140,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff908,&local_6f0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff908);
                testing::Message::~Message((Message *)0x3d6c6a);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d6cc2);
              local_2c = CfdAddScriptHashLastSignByHandle
                                   ((void *)CONCAT17(uVar2,in_stack_fffffffffffff738),this_01,
                                    in_stack_fffffffffffff728,in_stack_fffffffffffff724,
                                    in_stack_fffffffffffff720,&this_00->success_);
              in_stack_fffffffffffff8f4 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                         in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffff8f8);
              if (!bVar1) {
                testing::Message::Message((Message *)&stack0xfffffffffffff8e8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d6dbd);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff8e0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x145,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff8e0,
                           (Message *)&stack0xfffffffffffff8e8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff8e0);
                testing::Message::~Message((Message *)0x3d6e20);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d6e75);
            }
          }
          if (local_488 != 0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
            local_488 = 0;
          }
          if (local_490 != (bool *)0x0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
            local_490 = (bool *)0x0;
          }
          if (local_498 != 0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
            local_498 = 0;
          }
        }
        else {
          in_stack_fffffffffffff4b8 = (CfdErrorCode *)alStack_408[local_478 * 0x11 + -3];
          in_stack_fffffffffffff4c0 = (char *)alStack_408[local_478 * 0x11 + -4];
          in_stack_fffffffffffff4b0 =
               (AssertionResult *)CONCAT44((int)((ulong)in_stack_fffffffffffff4b0 >> 0x20),1);
          local_958 = (bool *)((ulong)local_958 & 0xffffffff00000000);
          local_2c = CfdAddSignWithPrivkeyByHandle
                               (in_stack_fffffffffffff908.data_,in_stack_fffffffffffff900.ptr_,
                                in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f4,
                                (char *)in_stack_fffffffffffff8e8.ptr_,in_stack_fffffffffffff8e4,
                                (bool)in_stack_fffffffffffff8e3,(bool)in_stack_fffffffffffff8e2,
                                (char *)in_stack_fffffffffffff930.data_,
                                (char *)in_stack_fffffffffffff938.ptr_);
          local_574 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                     in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_570);
          if (!bVar1) {
            testing::Message::Message(&local_580);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d5a71);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffa78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x105,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffa78,&local_580);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa78)
            ;
            testing::Message::~Message((Message *)0x3d5ad4);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5b29);
        }
      }
      if (local_2c == 0) {
        local_778 = (char *)0x0;
        local_2c = CfdFinalizeTransaction(in_stack_fffffffffffff4b0,local_958,(char **)0x3d72d3);
        local_78c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                   in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_788);
        if (!bVar1) {
          testing::Message::Message(&local_798);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d7375);
          testing::internal::AssertHelper::AssertHelper
                    (&local_7a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x164,pcVar4);
          testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
          testing::internal::AssertHelper::~AssertHelper(&local_7a0);
          testing::Message::~Message((Message *)0x3d73d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7430);
        if (local_2c == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_7b0,"exp_datas[idx].signed_tx","tx_hex",
                     *(char **)(abStack_3e8 + local_478 * 0x88 + -8),local_778);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7b0);
          if (!bVar1) {
            testing::Message::Message((Message *)&stack0xfffffffffffff848);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d74f3);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff840,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x166,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff840,(Message *)&stack0xfffffffffffff848)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff840)
            ;
            testing::Message::~Message((Message *)0x3d7556);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d75ab);
          CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
        }
      }
      if (local_2c == 0) {
        local_2c = CfdVerifyTxSignByHandle
                             (in_stack_fffffffffffff648,
                              (void *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
                              &in_stack_fffffffffffff638->success_,
                              (uint32_t)((ulong)in_stack_fffffffffffff630 >> 0x20));
        if ((local_2c != 0) && ((local_559 & 1) != 0)) {
          pcVar4 = (char *)0x0;
          CfdGetLastErrorMessage(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
          in_stack_fffffffffffff830 = "The script analysis of tapscript is not supported.";
          in_stack_fffffffffffff548 = (AssertionResult *)(local_7e8 + 1);
          testing::internal::CmpHelperSTREQ
                    ((internal *)in_stack_fffffffffffff548,"tapscript_err_msg","err_msg",
                     "The script analysis of tapscript is not supported.",pcVar4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff548);
          if (!bVar1) {
            testing::Message::Message(local_7e8);
            in_stack_fffffffffffff540 =
                 (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3d7709);
            testing::internal::AssertHelper::AssertHelper
                      (&local_7f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x172,(char *)in_stack_fffffffffffff540);
            testing::internal::AssertHelper::operator=(&local_7f0,local_7e8);
            testing::internal::AssertHelper::~AssertHelper(&local_7f0);
            testing::Message::~Message((Message *)0x3d776c);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d77c1);
          iVar3 = strcmp(in_stack_fffffffffffff830,pcVar4);
          if (iVar3 == 0) {
            local_2c = 0;
          }
          CfdFreeStringBuffer((char *)in_stack_fffffffffffff4b8);
          in_stack_fffffffffffff838 = (char *)0x0;
        }
        local_804 = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                   in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_800);
        if (!bVar1) {
          testing::Message::Message(&local_810);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d78ae);
          testing::internal::AssertHelper::AssertHelper
                    (&local_818,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x179,pcVar4);
          testing::internal::AssertHelper::operator=(&local_818,&local_810);
          testing::internal::AssertHelper::~AssertHelper(&local_818);
          testing::Message::~Message((Message *)0x3d7911);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7966);
        if (local_2c != 0) {
          in_stack_fffffffffffff7d4 = 0xffffffff;
          testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                    ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                     in_stack_fffffffffffff4b8,(unsigned_long *)in_stack_fffffffffffff4b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_828);
          if (!bVar1) {
            testing::Message::Message(&local_838);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d7a15);
            testing::internal::AssertHelper::AssertHelper
                      (&local_840,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x17b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_840,&local_838);
            testing::internal::AssertHelper::~AssertHelper(&local_840);
            testing::Message::~Message((Message *)0x3d7a72);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7ac7);
        }
      }
      in_stack_fffffffffffff7bc = CfdFreeTransactionHandle(in_stack_fffffffffffff4b0,local_958);
      in_stack_fffffffffffff7a4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                 in_stack_fffffffffffff4b8,(int *)in_stack_fffffffffffff4b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff7a8);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffff798);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d7b88);
        testing::internal::AssertHelper::AssertHelper
                  (&local_870,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x180,pcVar4);
        testing::internal::AssertHelper::operator=(&local_870,(Message *)&stack0xfffffffffffff798);
        testing::internal::AssertHelper::~AssertHelper(&local_870);
        testing::Message::~Message((Message *)0x3d7be5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7c3a);
    }
  }
  local_2c = CfdFreeHandle(in_stack_fffffffffffff4b8);
  local_884 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
             (int *)in_stack_fffffffffffff4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_880);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d7d0c);
    testing::internal::AssertHelper::AssertHelper
              (&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x192,pcVar4);
    testing::internal::AssertHelper::operator=(&local_898,&local_890);
    testing::internal::AssertHelper::~AssertHelper(&local_898);
    testing::Message::~Message((Message *)0x3d7d69);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d7dbe);
  return;
}

Assistant:

TEST(cfdcapi_transaction, SignTransactionTest) {
  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdSignTransactionTestData {
    int network;
    const char* txid;
    uint32_t vout;
    const char* descriptor;
    int64_t utxo_amount;
    const char* redeem_script;
    const char* tapscript_control;
    const char* tapleaf_hash;
    const char* annex;
    const char* aux_rand;
    const char* pubkey;
    const char* privkey;
    int sighash_type;
    const char* txout_address;
    int64_t amount;
    const char* signed_tx;
    bool use_direct_sign;
    int hash_type;
  };
  const struct CfdSignTransactionTestData exp_datas[] = {
    {  // p2wpkh
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000",
      false, kCfdP2wpkh
    },
    {  // p2wpkh auto sign
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000",
      true, kCfdP2wpkh
    },
    {  // p2wsh-multisig
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wsh(multi(1,023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae))",
      2500000000,
      "5121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c442103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae52ae",
      nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20300473044022050da44f8a8e8ac494b79840c4c7ef7d55a296ffa0b98a5b9d2150964ba6d555802207ae9ec8a4f060440279fa9129ef480132cab1fc638c534ef31af1feda6b5d6f401475121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c442103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae52ae00000000",
      false, kCfdP2wsh
    },
    {  // taproot schnorr
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014142ec41bf6c27451b785da1f4e8d50ffa0d9360e3265b55e3b044ed4b96f32d1b13c61987ffd13da2a444d495856a9c97d91b72b61d105921285271bac30ff7c70100000000",
      false, kCfdTaproot
    },
    {  // taproot schnorr auto sign
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014142ec41bf6c27451b785da1f4e8d50ffa0d9360e3265b55e3b044ed4b96f32d1b13c61987ffd13da2a444d495856a9c97d91b72b61d105921285271bac30ff7c70100000000",
      true, kCfdTaproot
    },
    {  // taproot schnorr rand
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916",
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014151df55894d1a024c244e20ecedc39cae39fa6d43653305b7f32605eea6359415a7ceef44c52a2f26be2e06d33d79c2e90b5dfaebcb4f79e242134121e0b9579e0100000000",
      false, kCfdTaproot
    },
    {  // tapscript
      kCfdNetworkRegtest,
      "195d6c18afaa6c33dcc2da86c6c0cd3f93ec2b44e4c8e9be00c7000eafa1805b", 0,
      "raw(51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2)",
      2499999000,
      "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
      "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
      "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
      nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5034146f705415495d40c409565862c6da85f4a74318f9d5733b073318059500cf5705ef4ecdc3da1f71d9a687a974433e030395e7876271bf2d80d7880006ede7fd70122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000",
      false, kCfdTaproot
    },
  };
  size_t list_size = sizeof(exp_datas) / sizeof(struct CfdSignTransactionTestData);

  for (size_t idx = 0; idx < list_size; ++idx) {
    void* create_handle = nullptr;
    char* sighash = nullptr;
    char* sig = nullptr;
    char* tmp_sig = nullptr;
    ret = CfdInitializeTransaction(
        handle, exp_datas[idx].network, 2, 0, nullptr, &create_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((NULL == create_handle));
    if (ret == kCfdSuccess) {
      ret = CfdSetTransactionUtxoData(handle, create_handle,
          exp_datas[idx].txid, exp_datas[idx].vout, exp_datas[idx].utxo_amount,
          nullptr, exp_datas[idx].descriptor, nullptr, nullptr, nullptr, true);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTransactionOutput(handle, create_handle,
          exp_datas[idx].amount, exp_datas[idx].txout_address, nullptr, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);

      bool has_tapscript = false;
      if (ret != kCfdSuccess) {
        // do nothing
      } else if (exp_datas[idx].use_direct_sign) {
        ret = CfdAddSignWithPrivkeyByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout, exp_datas[idx].privkey,
            exp_datas[idx].sighash_type, false, true, exp_datas[idx].aux_rand,
            exp_datas[idx].annex);
        EXPECT_EQ(kCfdSuccess, ret);
      } else {
        uint32_t code_separator_pos = cfd::core::kDefaultCodeSeparatorPosition;
        ret = CfdCreateSighashByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout,
            exp_datas[idx].sighash_type, false,
            (exp_datas[idx].redeem_script) ? nullptr : exp_datas[idx].pubkey,
            exp_datas[idx].redeem_script,
            exp_datas[idx].tapleaf_hash, code_separator_pos,
            exp_datas[idx].annex, &sighash);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret != kCfdSuccess) {
          // do nothing
        } else if (strlen(exp_datas[idx].pubkey) == 64) {
          // taproot/tapscript
          ret = CfdSignSchnorr(handle, sighash,
              exp_datas[idx].privkey, exp_datas[idx].aux_rand, &tmp_sig);
          EXPECT_EQ(kCfdSuccess, ret);
          ret = CfdAddSighashTypeInSchnorrSignature(handle, tmp_sig,
              exp_datas[idx].sighash_type, false, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          if (exp_datas[idx].redeem_script != nullptr) {
            has_tapscript = true;
            ret = CfdAddTxSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                exp_datas[idx].hash_type, sig, false,
                exp_datas[idx].sighash_type, false, true);
            EXPECT_EQ(kCfdSuccess, ret);

            ret = CfdAddTaprootSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                nullptr, exp_datas[idx].redeem_script,
                exp_datas[idx].tapscript_control, exp_datas[idx].annex);
            EXPECT_EQ(kCfdSuccess, ret);
          } else {
            ret = CfdAddTaprootSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                sig, nullptr, nullptr, exp_datas[idx].annex);
            EXPECT_EQ(kCfdSuccess, ret);
          }
        } else if (exp_datas[idx].redeem_script != nullptr) {
          // script
          ret = CfdCalculateEcSignature(handle, sighash,
              exp_datas[idx].privkey, nullptr,
              exp_datas[idx].network, true, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          // multisig first
          ret = CfdAddTxSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, "", false,
              exp_datas[idx].sighash_type, false, true);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddTxSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, sig, true,
              exp_datas[idx].sighash_type, false, false);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddScriptHashLastSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, exp_datas[idx].redeem_script);
          EXPECT_EQ(kCfdSuccess, ret);
        } else {
          ret = CfdCalculateEcSignature(handle, sighash,
              exp_datas[idx].privkey, nullptr,
              exp_datas[idx].network, true, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddPubkeyHashSignByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout,
            exp_datas[idx].hash_type, exp_datas[idx].pubkey,
            sig, true, exp_datas[idx].sighash_type, false);
          EXPECT_EQ(kCfdSuccess, ret);
        }

        if (sighash != nullptr) {
          CfdFreeStringBuffer(sighash);
          sighash = nullptr;
        }
        if (sig != nullptr) {
          CfdFreeStringBuffer(sig);
          sig = nullptr;
        }
        if (tmp_sig != nullptr) {
          CfdFreeStringBuffer(tmp_sig);
          tmp_sig = nullptr;
        }
      }

      if (ret == kCfdSuccess) {
        char* tx_hex = nullptr;
        ret = CfdFinalizeTransaction(handle, create_handle, &tx_hex);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          EXPECT_STREQ(exp_datas[idx].signed_tx, tx_hex);
          CfdFreeStringBuffer(tx_hex);
        }
      }

      if (ret == kCfdSuccess) {
        ret = CfdVerifyTxSignByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout);
        if ((ret != kCfdSuccess) && has_tapscript) {
          char* err_msg = NULL;
          CfdGetLastErrorMessage(handle, &err_msg);
          const char* tapscript_err_msg = "The script analysis of tapscript is not supported.";
          EXPECT_STREQ(tapscript_err_msg, err_msg);
          if (strcmp(tapscript_err_msg, err_msg) == 0) {
            ret = kCfdSuccess;
          }
          CfdFreeStringBuffer(err_msg);
          err_msg = NULL;
        }
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret != kCfdSuccess) {
          EXPECT_EQ(-1, idx);
        }
      }

      int tmp_ret = CfdFreeTransactionHandle(handle, create_handle);
      EXPECT_EQ(kCfdSuccess, tmp_ret);
    }

#if 0
    ret = CfdGetLastErrorCode(handle);
    if (ret != kCfdSuccess) {
      char* str_buffer = NULL;
      ret = CfdGetLastErrorMessage(handle, &str_buffer);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("", str_buffer);
      CfdFreeStringBuffer(str_buffer);
      str_buffer = NULL;
      break;
    }
#endif
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}